

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ProcessResult *
process_dir(ProcessResult *__return_storage_ptr__,path *dir,
           vector<IncludePath,_std::allocator<IncludePath>_> *include_paths,
           map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
           *headers)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer pbVar2;
  pointer pbVar3;
  path *__p;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_164;
  allocator<char> local_163;
  allocator<char> local_162;
  allocator<char> local_161;
  ProcessResult *local_160;
  recursive_directory_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  EXT;
  path local_120;
  path file;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  path local_58;
  
  local_160 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,".cpp",(allocator<char> *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file._M_cmpts,".cxx",(allocator<char> *)&it);
  std::__cxx11::string::string<std::allocator<char>>(local_b8,".cc",&local_161);
  std::__cxx11::string::string<std::allocator<char>>(local_98,".h",&local_162);
  std::__cxx11::string::string<std::allocator<char>>(local_78,".hpp",&local_163);
  __l._M_len = 5;
  __l._M_array = &file._M_pathname;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&EXT,__l,&local_164);
  lVar5 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&file._M_pathname._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  local_160->untouched = 0;
  local_160->failed = 0;
  local_160->system_to_user = 0;
  local_160->user_to_system = 0;
  local_160->total = 0;
  local_160->replaced_path = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator(&it,dir);
  while( true ) {
    _Var1._M_pi = it._M_dirs._M_refcount._M_pi;
    file._M_pathname._M_dataplus._M_p = (pointer)0x0;
    file._M_pathname._M_string_length = 0;
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&file);
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
    __p = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
    std::filesystem::__cxx11::path::path(&file,__p);
    pbVar3 = EXT.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = EXT.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::filesystem::__cxx11::path::extension(&local_120,&file);
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::filesystem::__cxx11::path_const>>
                      (pbVar2,pbVar3,&local_120);
    pbVar2 = EXT.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::filesystem::__cxx11::path::~path(&local_120);
    if (_Var4._M_current != pbVar2) {
      std::filesystem::__cxx11::path::path(&local_58,&file);
      process_file(&local_58,include_paths,headers,local_160);
      std::filesystem::__cxx11::path::~path(&local_58);
    }
    std::filesystem::__cxx11::path::~path(&file);
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(&it);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&EXT);
  return local_160;
}

Assistant:

ProcessResult
process_dir(fs::path dir, const std::vector<IncludePath> &include_paths,
            const std::map<IncludePath, std::vector<fs::path>> &headers) {
  const std::vector<std::string> EXT = {".cpp", ".cxx", ".cc", ".h", ".hpp"};

  ProcessResult result{};

  for (fs::recursive_directory_iterator it(dir);
       it != fs::recursive_directory_iterator(); ++it) {
    fs::path file = it->path();
    if (std::find(EXT.begin(), EXT.end(), file.extension()) != EXT.end()) {
      process_file(file, include_paths, headers, &result);
    }
  }

  return result;
}